

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O1

void printXYAsMathematicaList<long_double>
               (vector<long_double,_std::allocator<long_double>_> *values)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = (long)(values->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(values->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar4 = lVar2 >> 4;
  lVar3 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  if (0 < lVar4) {
    do {
      if (lVar3 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
      poVar1 = std::ostream::_M_insert<double>((double)lVar3 / (double)(lVar2 >> 3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           ((long)(values->
                                  super__Vector_base<long_double,_std::allocator<long_double>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar3 * 8 + -8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
      lVar3 = lVar3 + 2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void printXYAsMathematicaList(const vector<Num> &values) {
	long L = values.size();
	cout << "{";
	for (long i = 0; i < L; ++i) {
		if (i > 0) cout << ",";
		cout << "{" << alphaForIndex<double>(i, L) << "," << values[i] << "}";
	}
	cout << "}" << endl;
}